

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitterBeam.cpp
# Opt level: O0

KBOOL __thiscall KDIS::DATA_TYPE::EmitterBeam::operator==(EmitterBeam *this,EmitterBeam *Value)

{
  KBOOL KVar1;
  bool bVar2;
  EmitterBeam *Value_local;
  EmitterBeam *this_local;
  
  if (this->m_ui8BeamDataLength == Value->m_ui8BeamDataLength) {
    if (this->m_ui8EmitterBeamIDNumber == Value->m_ui8EmitterBeamIDNumber) {
      if (this->m_ui16BeamParamIndex == Value->m_ui16BeamParamIndex) {
        KVar1 = FundamentalParameterData::operator!=
                          (&this->m_FundamentalParameterData,&Value->m_FundamentalParameterData);
        if (KVar1) {
          this_local._7_1_ = false;
        }
        else if (this->m_ui8BeamFunction == Value->m_ui8BeamFunction) {
          if (this->m_ui8NumTargetInTrackJamField == Value->m_ui8NumTargetInTrackJamField) {
            if (this->m_ui8HighDensityTrackJam == Value->m_ui8HighDensityTrackJam) {
              KVar1 = BeamStatus::operator!=(&this->m_BeamStatus,&Value->m_BeamStatus);
              if (KVar1) {
                this_local._7_1_ = false;
              }
              else {
                KVar1 = JammingTechnique::operator!=
                                  (&this->m_JammingTechnique,&Value->m_JammingTechnique);
                if (KVar1) {
                  this_local._7_1_ = false;
                }
                else {
                  bVar2 = std::operator!=(&this->m_vTrackJamTargets,&Value->m_vTrackJamTargets);
                  if (bVar2) {
                    this_local._7_1_ = false;
                  }
                  else {
                    this_local._7_1_ = true;
                  }
                }
              }
            }
            else {
              this_local._7_1_ = false;
            }
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

KBOOL EmitterBeam::operator == ( const EmitterBeam & Value ) const
{
    if( m_ui8BeamDataLength             != Value.m_ui8BeamDataLength )           return false;
    if( m_ui8EmitterBeamIDNumber        != Value.m_ui8EmitterBeamIDNumber )      return false;
    if( m_ui16BeamParamIndex            != Value.m_ui16BeamParamIndex )          return false;
    if( m_FundamentalParameterData      != Value.m_FundamentalParameterData )    return false;
    if( m_ui8BeamFunction               != Value.m_ui8BeamFunction )             return false;
    if( m_ui8NumTargetInTrackJamField   != Value.m_ui8NumTargetInTrackJamField ) return false;
    if( m_ui8HighDensityTrackJam        != Value.m_ui8HighDensityTrackJam )      return false;
#if DIS_VERSION < 7
    if( m_ui32JammingModeSequence       != Value.m_ui32JammingModeSequence )     return false;
#elif DIS_VERSION > 6
    if( m_BeamStatus                    != Value.m_BeamStatus )                  return false;
    if( m_JammingTechnique              != Value.m_JammingTechnique )            return false;
#endif
    if( m_vTrackJamTargets              != Value.m_vTrackJamTargets )            return false;
    return true;
}